

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O1

void printBasisSGDInfo(ktx_uint8_t *bgd,ktx_uint64_t byteLength,ktx_uint32_t numImages)

{
  ktxBasisLzGlobalHeader *bgdh;
  ulong uVar1;
  
  if (0x13 < byteLength) {
    fprintf(_stdout,"endpointCount: %u\n",(ulong)*(ushort *)bgd);
    fprintf(_stdout,"selectorCount: %u\n",(ulong)*(ushort *)(bgd + 2));
    fprintf(_stdout,"endpointsByteLength: %u\n",(ulong)*(uint *)(bgd + 4));
    fprintf(_stdout,"selectorsByteLength: %u\n",(ulong)*(uint *)(bgd + 8));
    fprintf(_stdout,"tablesByteLength: %u\n",(ulong)*(uint *)(bgd + 0xc));
    fprintf(_stdout,"extendedByteLength: %u\n",(ulong)*(uint *)(bgd + 0x10));
    if (numImages != 0) {
      uVar1 = 0x28;
      do {
        if (byteLength < uVar1) {
          return;
        }
        fprintf(_stdout,"\nimageFlags: %#x\n",(ulong)*(uint *)(bgd + (uVar1 - 0x14)));
        fprintf(_stdout,"rgbSliceByteLength: %u\n",(ulong)*(uint *)(bgd + (uVar1 - 0xc)));
        fprintf(_stdout,"rgbSliceByteOffset: %#x\n",(ulong)*(uint *)(bgd + (uVar1 - 0x10)));
        fprintf(_stdout,"alphaSliceByteLength: %u\n",(ulong)*(uint *)(bgd + (uVar1 - 4)));
        fprintf(_stdout,"alphaSliceByteOffset: %#x\n",(ulong)*(uint *)(bgd + (uVar1 - 8)));
        uVar1 = uVar1 + 0x14;
        numImages = numImages - 1;
      } while (numImages != 0);
    }
  }
  return;
}

Assistant:

void
printBasisSGDInfo(ktx_uint8_t* bgd, ktx_uint64_t byteLength,
                ktx_uint32_t numImages)
{
    ktxBasisLzGlobalHeader* bgdh = (ktxBasisLzGlobalHeader*)(bgd);
    if (byteLength < sizeof(ktxBasisLzGlobalHeader))
        return;

    fprintf(stdout, "endpointCount: %u\n", bgdh->endpointCount);
    fprintf(stdout, "selectorCount: %u\n", bgdh->selectorCount);
    fprintf(stdout, "endpointsByteLength: %u\n", bgdh->endpointsByteLength);
    fprintf(stdout, "selectorsByteLength: %u\n", bgdh->selectorsByteLength);
    fprintf(stdout, "tablesByteLength: %u\n", bgdh->tablesByteLength);
    fprintf(stdout, "extendedByteLength: %u\n", bgdh->extendedByteLength);

    ktxBasisLzEtc1sImageDesc* slices = (ktxBasisLzEtc1sImageDesc*)(bgd + sizeof(ktxBasisLzGlobalHeader));
    for (ktx_uint32_t i = 0; i < numImages; i++) {
        if (byteLength < (i + 1) * sizeof(ktxBasisLzEtc1sImageDesc) + sizeof(ktxBasisLzGlobalHeader))
            break;

        fprintf(stdout, "\nimageFlags: %#x\n", slices[i].imageFlags);
        fprintf(stdout, "rgbSliceByteLength: %u\n", slices[i].rgbSliceByteLength);
        fprintf(stdout, "rgbSliceByteOffset: %#x\n", slices[i].rgbSliceByteOffset);
        fprintf(stdout, "alphaSliceByteLength: %u\n", slices[i].alphaSliceByteLength);
        fprintf(stdout, "alphaSliceByteOffset: %#x\n", slices[i].alphaSliceByteOffset);
    }
}